

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall
QScrollerPrivate::createScrollingSegments
          (QScrollerPrivate *this,qreal v,qreal startPos,qreal deltaTime,qreal deltaPos,
          Orientation orientation)

{
  QScrollerPropertiesPrivate *pQVar1;
  char cVar2;
  Type TVar3;
  QDebug *pQVar4;
  ScrollType type;
  QQueue<QScrollerPrivate::ScrollSegment> *this_00;
  bool bVar5;
  long in_FS_OFFSET;
  bool bVar6;
  ulong uVar7;
  double p;
  qreal qVar8;
  double t;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_128;
  double local_108;
  qreal local_e8;
  double local_c8;
  qreal local_b8;
  QDebug local_80;
  undefined1 local_78 [8];
  QDebug local_70;
  undefined1 local_68 [8];
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->properties).d.d;
  bVar6 = orientation != Horizontal;
  this_00 = &this->ySegments;
  if (!bVar6) {
    this_00 = &this->xSegments;
  }
  QList<QScrollerPrivate::ScrollSegment>::clear
            (&this_00->super_QList<QScrollerPrivate::ScrollSegment>);
  dVar11 = (&(this->contentPosRange).xp)[bVar6];
  dVar10 = (&(this->contentPosRange).w)[bVar6] + dVar11;
  if (((&pQVar1->hOvershootPolicy)[bVar6] == OvershootAlwaysOff) ||
     ((pQVar1->overshootScrollDistanceFactor == 0.0 && (!NAN(pQVar1->overshootScrollDistanceFactor))
      ))) {
    bVar5 = false;
  }
  else {
    bVar5 = dVar10 != 0.0 || (&pQVar1->hOvershootPolicy)[bVar6] == OvershootAlwaysOn;
  }
  dVar9 = (&(this->viewportSize).wd)[bVar6];
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_60 = 2;
    local_5c = 0;
    uStack_54 = 0;
    local_4c = 0;
    local_48 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_40,"+++ createScrollingSegments: s:");
    pQVar4 = QDebug::operator<<(pQVar4,startPos);
    pQVar4 = QDebug::operator<<(pQVar4,"maxPos:");
    pQVar4 = QDebug::operator<<(pQVar4,dVar10);
    pQVar4 = QDebug::operator<<(pQVar4,"o:");
    QDebug::operator<<(pQVar4,orientation);
    QDebug::~QDebug(&local_40);
  }
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_60 = 2;
    local_5c = 0;
    uStack_54 = 0;
    local_4c = 0;
    local_48 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_40,"v = ");
    pQVar4 = QDebug::operator<<(pQVar4,v);
    pQVar4 = QDebug::operator<<(pQVar4,", decelerationFactor = ");
    pQVar4 = QDebug::operator<<(pQVar4,pQVar1->decelerationFactor);
    pQVar4 = QDebug::operator<<(pQVar4,", curveType = ");
    local_70.stream = pQVar4->stream;
    *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
    QEasingCurve::type();
    ::operator<<((Stream *)local_68,(Type)&local_70);
    QDebug::~QDebug((QDebug *)local_68);
    QDebug::~QDebug(&local_70);
    QDebug::~QDebug(&local_40);
  }
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_60 = 2;
    local_5c = 0;
    uStack_54 = 0;
    local_4c = 0;
    local_48 = lcScroller::category.name;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_40,"  Real Delta:");
    QDebug::operator<<(pQVar4,deltaPos);
    QDebug::~QDebug(&local_40);
  }
  p = startPos + deltaPos;
  if (((startPos < dVar11) && (p < dVar11)) || ((dVar10 < startPos && (dVar10 < p)))) {
    local_c8 = pQVar1->overshootScrollTime * 0.7;
    local_128 = (double)(~-(ulong)(p < dVar11) & (ulong)dVar10 |
                        (ulong)dVar11 & -(ulong)(p < dVar11));
    local_108 = local_128 - startPos;
    TVar3 = QEasingCurve::type();
    type = ScrollTypeOvershoot;
  }
  else {
    local_128 = nextSnapPos(this,p,0,orientation);
    qVar8 = nextSnapPos(this,startPos,-1,orientation);
    t = nextSnapPos(this,startPos,1,orientation);
    lcScroller();
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_60 = 2;
      local_5c = 0;
      uStack_54 = 0;
      local_4c = 0;
      local_48 = lcScroller::category.name;
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<(&local_40,"  Real Delta:");
      pQVar4 = QDebug::operator<<(pQVar4,qVar8);
      pQVar4 = QDebug::operator<<(pQVar4,'-');
      pQVar4 = QDebug::operator<<(pQVar4,local_128);
      pQVar4 = QDebug::operator<<(pQVar4,'-');
      QDebug::operator<<(pQVar4,t);
      QDebug::~QDebug(&local_40);
    }
    if ((t < local_128) || (cVar2 = qIsNaN(t), cVar2 != '\0')) {
      t = local_128;
    }
    if ((local_128 < qVar8) || (cVar2 = qIsNaN(qVar8), cVar2 != '\0')) {
      qVar8 = local_128;
    }
    uVar7 = -(ulong)(v < -v);
    if (pQVar1->minimumVelocity <= (double)(~uVar7 & (ulong)v | (ulong)-v & uVar7)) {
      if ((v <= 0.0) || (cVar2 = qIsNaN(t), cVar2 != '\0')) {
        if ((v < 0.0) && (cVar2 = qIsNaN(qVar8), cVar2 == '\0')) {
          t = qVar8;
          if (p - startPos == 0.0) goto joined_r0x005de589;
          goto LAB_005de58f;
        }
        local_128 = p;
        local_c8 = deltaTime;
        if (p < dVar11 || dVar10 < p) {
          local_128 = (double)(~-(ulong)(p < dVar11) & (ulong)dVar10 |
                              (ulong)dVar11 & -(ulong)(p < dVar11));
          lcScroller();
          if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             ) {
            local_60 = 2;
            local_5c = 0;
            uStack_54 = 0;
            local_4c = 0;
            local_48 = lcScroller::category.name;
            QMessageLogger::debug();
            pQVar4 = QDebug::operator<<(&local_40,"Overshoot: delta:");
            QDebug::operator<<(pQVar4,local_128 - startPos);
            QDebug::~QDebug(&local_40);
          }
          if (bVar5) {
            dVar11 = (local_128 - startPos) / deltaPos;
            uVar7 = -(ulong)(dVar11 < -dVar11);
            qVar8 = progressForValue(&pQVar1->scrollingCurve,
                                     (qreal)(~uVar7 & (ulong)dVar11 | (ulong)-dVar11 & uVar7));
            local_c8 = pQVar1->overshootScrollTime;
            local_b8 = (local_c8 * 0.3) / deltaTime + qVar8;
            if (1.0 <= local_b8) {
              local_b8 = 1.0;
            }
            dVar11 = (double)QEasingCurve::valueForProgress(local_b8);
            local_e8 = (dVar11 * deltaPos + startPos) - local_128;
            dVar11 = dVar9 * pQVar1->overshootScrollDistanceFactor *
                     (double)(-(ulong)(local_e8 < 0.0) & 0xbff0000000000000 |
                             ~-(ulong)(local_e8 < 0.0) &
                             -(ulong)(0.0 < local_e8) & 0x3ff0000000000000);
            lcScroller();
            if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
                0) {
              local_60 = 2;
              local_5c = 0;
              uStack_54 = 0;
              local_4c = 0;
              local_48 = lcScroller::category.name;
              QMessageLogger::debug();
              pQVar4 = QDebug::operator<<(&local_40,"1 oDistance:");
              pQVar4 = QDebug::operator<<(pQVar4,local_e8);
              pQVar4 = QDebug::operator<<(pQVar4,"Max:");
              pQVar4 = QDebug::operator<<(pQVar4,dVar11);
              pQVar4 = QDebug::operator<<(pQVar4,"stopP/oStopP");
              pQVar4 = QDebug::operator<<(pQVar4,qVar8);
              QDebug::operator<<(pQVar4,local_b8);
              QDebug::~QDebug(&local_40);
            }
            local_108 = -local_e8;
            dVar10 = -dVar11;
            if ((double)(~-(ulong)(local_e8 < local_108) & (ulong)local_e8 |
                        -(ulong)(local_e8 < local_108) & (ulong)local_108) <=
                (double)(~-(ulong)(dVar11 < dVar10) & (ulong)dVar11 |
                        -(ulong)(dVar11 < dVar10) & (ulong)dVar10)) {
              local_e8 = local_128 + local_e8;
            }
            else {
              local_e8 = local_128 + dVar11;
              dVar9 = (local_e8 - startPos) / deltaPos;
              uVar7 = -(ulong)(dVar9 < -dVar9);
              local_b8 = progressForValue(&pQVar1->scrollingCurve,
                                          (qreal)(~uVar7 & (ulong)dVar9 | (ulong)-dVar9 & uVar7));
              lcScroller();
              local_108 = dVar10;
              if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                  != 0) {
                local_60 = 2;
                local_5c = 0;
                uStack_54 = 0;
                local_4c = 0;
                local_48 = lcScroller::category.name;
                QMessageLogger::debug();
                pQVar4 = QDebug::operator<<(&local_40,"2 oDistance:");
                pQVar4 = QDebug::operator<<(pQVar4,dVar11);
                pQVar4 = QDebug::operator<<(pQVar4,"Max:");
                pQVar4 = QDebug::operator<<(pQVar4,dVar11);
                pQVar4 = QDebug::operator<<(pQVar4,"stopP/oStopP");
                pQVar4 = QDebug::operator<<(pQVar4,qVar8);
                QDebug::operator<<(pQVar4,local_b8);
                QDebug::~QDebug(&local_40);
              }
            }
            TVar3 = QEasingCurve::type();
            pushSegment(this,ScrollTypeFlick,deltaTime,local_b8,startPos,deltaPos,local_e8,TVar3,
                        orientation);
            local_c8 = local_c8 * 0.7;
            TVar3 = QEasingCurve::type();
            type = ScrollTypeOvershoot;
            startPos = local_e8;
            goto LAB_005ddd22;
          }
        }
      }
      else {
        if (p - startPos == 0.0) {
joined_r0x005de589:
          if (NAN(p - startPos)) goto LAB_005de58f;
        }
        else {
LAB_005de58f:
          dVar11 = (t - startPos) / (p - startPos);
          uVar7 = -(ulong)(dVar11 < -dVar11);
          deltaTime = deltaTime * (double)(~uVar7 & (ulong)dVar11 | (ulong)-dVar11 & uVar7);
        }
        local_c8 = pQVar1->snapTime;
        local_128 = t;
        if (deltaTime <= local_c8) {
          local_c8 = deltaTime;
        }
      }
      TVar3 = QEasingCurve::type();
      type = ScrollTypeFlick;
      local_108 = deltaPos;
    }
    else {
      lcScroller();
      if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_60 = 2;
        local_5c = 0;
        uStack_54 = 0;
        local_4c = 0;
        local_48 = lcScroller::category.name;
        QMessageLogger::debug();
        pQVar4 = QDebug::operator<<(&local_40,"### below minimum Vel");
        local_80.stream = pQVar4->stream;
        *(int *)(local_80.stream + 0x28) = *(int *)(local_80.stream + 0x28) + 1;
        ::operator<<((Stream *)local_78,(Orientation)&local_80);
        QDebug::~QDebug((QDebug *)local_78);
        QDebug::~QDebug(&local_80);
        QDebug::~QDebug(&local_40);
      }
      cVar2 = qIsNaN(local_128);
      if (local_128 == startPos || cVar2 != '\0') goto LAB_005ddd2b;
      dVar11 = pQVar1->snapPositionRatio;
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        dVar10 = (&(this->lastPosition).xp)[orientation != Horizontal] -
                 (&(this->pressPosition).xp)[orientation != Horizontal];
        dVar11 = dVar10 / dVar11;
        uVar7 = -(ulong)(dVar11 < -dVar11);
        if ((double)(~uVar7 & (ulong)dVar11 | (ulong)-dVar11 & uVar7) <= t - qVar8) {
          uVar7 = -(ulong)(dVar10 < 0.0);
          local_128 = (double)(~uVar7 & (ulong)t | (ulong)qVar8 & uVar7);
        }
      }
      dVar11 = (local_128 - startPos) * 0.3 + startPos;
      pushSegment(this,ScrollTypeFlick,pQVar1->snapTime * 0.3,1.0,startPos,dVar11 - startPos,dVar11,
                  InQuad,orientation);
      local_c8 = pQVar1->snapTime * 0.7;
      local_108 = local_128 - dVar11;
      TVar3 = QEasingCurve::type();
      type = ScrollTypeFlick;
      startPos = dVar11;
    }
  }
LAB_005ddd22:
  pushSegment(this,type,local_c8,1.0,startPos,local_108,local_128,TVar3,orientation);
LAB_005ddd2b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::createScrollingSegments(qreal v, qreal startPos,
                                               qreal deltaTime, qreal deltaPos,
                                               Qt::Orientation orientation)
{
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    QScrollerProperties::OvershootPolicy policy;
    qreal minPos;
    qreal maxPos;
    qreal viewSize;

    if (orientation == Qt::Horizontal) {
        xSegments.clear();
        policy = sp->hOvershootPolicy;
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
        viewSize = viewportSize.width();
    } else {
        ySegments.clear();
        policy = sp->vOvershootPolicy;
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
        viewSize = viewportSize.height();
    }

    bool alwaysOvershoot = (policy == QScrollerProperties::OvershootAlwaysOn);
    bool noOvershoot = (policy == QScrollerProperties::OvershootAlwaysOff) || !sp->overshootScrollDistanceFactor;
    bool canOvershoot = !noOvershoot && (alwaysOvershoot || maxPos);

    qCDebug(lcScroller) << "+++ createScrollingSegments: s:" << startPos << "maxPos:" << maxPos
                        << "o:" << int(orientation);

    qCDebug(lcScroller) << "v = " << v << ", decelerationFactor = " << sp->decelerationFactor
                        << ", curveType = " << sp->scrollingCurve.type();

    qreal endPos = startPos + deltaPos;

    qCDebug(lcScroller) << "  Real Delta:" << deltaPos;

    // -- check if are in overshoot and end in overshoot
    if ((startPos < minPos && endPos < minPos) ||
        (startPos > maxPos && endPos > maxPos)) {
        qreal stopPos = endPos < minPos ? minPos : maxPos;
        qreal oDeltaTime = sp->overshootScrollTime;

        pushSegment(ScrollTypeOvershoot, oDeltaTime * qreal(0.7), qreal(1.0), startPos,
                    stopPos - startPos, stopPos, sp->scrollingCurve.type(), orientation);
        return;
    }

    // -- determine snap points
    qreal nextSnap = nextSnapPos(endPos, 0, orientation);
    qreal lowerSnapPos = nextSnapPos(startPos, -1, orientation);
    qreal higherSnapPos = nextSnapPos(startPos, 1, orientation);

    qCDebug(lcScroller) << "  Real Delta:" << lowerSnapPos << '-' << nextSnap << '-' <<higherSnapPos;

    // - check if we can reach another snap point
    if (nextSnap > higherSnapPos || qIsNaN(higherSnapPos))
        higherSnapPos = nextSnap;
    if (nextSnap < lowerSnapPos || qIsNaN(lowerSnapPos))
        lowerSnapPos = nextSnap;

    if (qAbs(v) < sp->minimumVelocity) {

        qCDebug(lcScroller) << "### below minimum Vel" << orientation;

        // - no snap points or already at one
        if (qIsNaN(nextSnap) || nextSnap == startPos)
            return; // nothing to do, no scrolling needed.

        // - decide which point to use

        qreal snapDistance = higherSnapPos - lowerSnapPos;

        qreal pressDistance = (orientation == Qt::Horizontal) ?
            lastPosition.x() - pressPosition.x() :
            lastPosition.y() - pressPosition.y();

        // if not dragged far enough, pick the next snap point.
        if (sp->snapPositionRatio == 0.0 || qAbs(pressDistance / sp->snapPositionRatio) > snapDistance)
            endPos = nextSnap;
        else if (pressDistance < 0.0)
            endPos = lowerSnapPos;
        else
            endPos = higherSnapPos;

        deltaPos = endPos - startPos;
        qreal midPos = startPos + deltaPos * qreal(0.3);
        pushSegment(ScrollTypeFlick, sp->snapTime * qreal(0.3), qreal(1.0), startPos,
                    midPos - startPos, midPos, QEasingCurve::InQuad, orientation);
        pushSegment(ScrollTypeFlick, sp->snapTime * qreal(0.7), qreal(1.0), midPos,
                    endPos - midPos, endPos, sp->scrollingCurve.type(), orientation);
        return;
    }

    // - go to the next snappoint if there is one
    if (v > 0 && !qIsNaN(higherSnapPos)) {
        // change the time in relation to the changed end position
        if (endPos - startPos)
            deltaTime *= qAbs((higherSnapPos - startPos) / (endPos - startPos));
        if (deltaTime > sp->snapTime)
            deltaTime = sp->snapTime;
        endPos = higherSnapPos;

    } else if (v < 0 && !qIsNaN(lowerSnapPos)) {
        // change the time in relation to the changed end position
        if (endPos - startPos)
            deltaTime *= qAbs((lowerSnapPos - startPos) / (endPos - startPos));
        if (deltaTime > sp->snapTime)
            deltaTime = sp->snapTime;
        endPos = lowerSnapPos;

    // -- check if we are overshooting
    } else if (endPos < minPos || endPos > maxPos) {
        qreal stopPos = endPos < minPos ? minPos : maxPos;

        qCDebug(lcScroller) << "Overshoot: delta:" << (stopPos - startPos);

        if (!canOvershoot) {
            pushSegment(ScrollTypeFlick, deltaTime, qreal(1), startPos, deltaPos, stopPos,
                        sp->scrollingCurve.type(), orientation);
        } else {
            qreal stopProgress = progressForValue(sp->scrollingCurve, qAbs((stopPos - startPos) / deltaPos));
            qreal oDeltaTime = sp->overshootScrollTime;
            qreal oStopProgress = qMin(stopProgress + oDeltaTime * qreal(0.3) / deltaTime, qreal(1));
            qreal oDistance = startPos + deltaPos * sp->scrollingCurve.valueForProgress(oStopProgress) - stopPos;
            qreal oMaxDistance = qSign(oDistance) * (viewSize * sp->overshootScrollDistanceFactor);

            qCDebug(lcScroller) << "1 oDistance:" << oDistance << "Max:" << oMaxDistance
                                << "stopP/oStopP" << stopProgress << oStopProgress;

            if (qAbs(oDistance) > qAbs(oMaxDistance)) {
                oStopProgress = progressForValue(sp->scrollingCurve,
                                                 qAbs((stopPos + oMaxDistance - startPos) / deltaPos));
                oDistance = oMaxDistance;
                qCDebug(lcScroller) << "2 oDistance:" << oDistance << "Max:" << oMaxDistance
                                    << "stopP/oStopP" << stopProgress << oStopProgress;
            }

            pushSegment(ScrollTypeFlick, deltaTime, oStopProgress, startPos, deltaPos,
                        stopPos + oDistance, sp->scrollingCurve.type(), orientation);
            pushSegment(ScrollTypeOvershoot, oDeltaTime * qreal(0.7), qreal(1.0),
                        stopPos + oDistance, -oDistance, stopPos, sp->scrollingCurve.type(),
                        orientation);
        }
        return;
    }

    pushSegment(ScrollTypeFlick, deltaTime, qreal(1.0), startPos, deltaPos, endPos,
                sp->scrollingCurve.type(), orientation);
}